

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *read1_filename,string *read2_filename,
          string *output_filename,LinkedReadsFormat format,string *default_name,int readsize)

{
  pointer pcVar1;
  string local_b8;
  LinkedReadsMapper *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_98 = &this->mapper;
  LinkedReadsMapper::LinkedReadsMapper(local_98,ws,this);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->default_name)._M_dataplus._M_p = (pointer)&(this->default_name).field_2;
  (this->default_name)._M_string_length = 0;
  (this->default_name).field_2._M_local_buf[0] = '\0';
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fd = (FILE *)0x0;
  this->ws = ws;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar1 = (output_filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + output_filename->_M_string_length);
  pcVar1 = (default_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + default_name->_M_string_length);
  pcVar1 = (read1_filename->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + read1_filename->_M_string_length);
  pcVar1 = (read2_filename->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + read2_filename->_M_string_length);
  build_from_fastq(&local_b8,&local_50,&local_70,&local_90,format,(long)readsize,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string read1_filename, std::string read2_filename,
                                           std::string output_filename, LinkedReadsFormat format,
                                           std::string default_name, int readsize) : ws(ws), mapper(ws, *this) {
    build_from_fastq(output_filename, default_name, read1_filename, read2_filename, format, readsize, 0);
}